

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclstubs.c
# Opt level: O0

void pnga_lu_solve(char *tran,Integer g_a,Integer g_b)

{
  Integer ndim;
  Integer dimsB [2];
  Integer dimsA [2];
  Integer typeB;
  Integer dimB2;
  Integer dimB1;
  Integer typeA;
  Integer dimA2;
  Integer dimA1;
  Integer in_stack_00000080;
  Integer in_stack_00000088;
  char *in_stack_00000090;
  Integer in_stack_00000128;
  char *in_stack_00000130;
  char *in_stack_00000188;
  Integer in_stack_00000190;
  Integer *in_stack_00000198;
  Integer *in_stack_000001a0;
  Integer *in_stack_000001a8;
  Integer in_stack_000001b0;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_50;
  
  pnga_check_handle(in_stack_00000190,in_stack_00000188);
  pnga_check_handle(in_stack_00000190,in_stack_00000188);
  pnga_inquire(in_stack_000001b0,in_stack_000001a8,in_stack_000001a0,in_stack_00000198);
  pnga_inquire(in_stack_000001b0,in_stack_000001a8,in_stack_000001a0,in_stack_00000198);
  if ((10000 < local_58 * local_50) || (10000 < local_68 * local_60)) {
    pnga_error(in_stack_00000130,in_stack_00000128);
  }
  pnga_lu_solve_seq(in_stack_00000090,in_stack_00000088,in_stack_00000080);
  return;
}

Assistant:

void pnga_lu_solve(char *tran, Integer g_a, Integer g_b) {

  Integer dimA1, dimA2, typeA;
  Integer dimB1, dimB2, typeB;
  Integer dimsA[2], dimsB[2], ndim;

  /** check GA info for input arrays */
  pnga_check_handle(g_a, "ga_lu_solve: a");
  pnga_check_handle(g_b, "ga_lu_solve: b");
  pnga_inquire (g_a, &typeA, &ndim, dimsA);
  pnga_inquire (g_b, &typeB, &ndim, dimsB);
  dimA1 = dimsA[0];
  dimA2 = dimsA[1];
  dimB1 = dimsB[0];
  dimB2 = dimsB[1];
  
  if( (dimA1*dimA2 > _MAX_PROB_SIZE_) || (dimB1*dimB2 > _MAX_PROB_SIZE_) )
    pnga_error("ga_lu_solve:Array size too large. Use scalapack for optimum performance. configure --with-scalapack or --with-scalapack-i8 for ga_lu_solve to use Scalapack interface",0L);

  pnga_lu_solve_seq(tran, g_a, g_b);
}